

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetScrollHereX(float center_x_ratio)

{
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float target_pos_x;
  float spacing_x;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  window_00 = GImGui->CurrentWindow;
  fVar2 = ImMax<float>((window_00->WindowPadding).x,(GImGui->Style).ItemSpacing.x);
  fVar3 = ImLerp<float>((pIVar1->LastItemData).Rect.Min.x - fVar2,
                        (pIVar1->LastItemData).Rect.Max.x + fVar2,in_XMM0_Da);
  SetScrollFromPosX(window_00,fVar3 - (window_00->Pos).x,in_XMM0_Da);
  fVar2 = ImMax<float>(0.0,(window_00->WindowPadding).x - fVar2);
  (window_00->ScrollTargetEdgeSnapDist).x = fVar2;
  return;
}

Assistant:

void ImGui::SetScrollHereX(float center_x_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float spacing_x = ImMax(window->WindowPadding.x, g.Style.ItemSpacing.x);
    float target_pos_x = ImLerp(g.LastItemData.Rect.Min.x - spacing_x, g.LastItemData.Rect.Max.x + spacing_x, center_x_ratio);
    SetScrollFromPosX(window, target_pos_x - window->Pos.x, center_x_ratio); // Convert from absolute to local pos

    // Tweak: snap on edges when aiming at an item very close to the edge
    window->ScrollTargetEdgeSnapDist.x = ImMax(0.0f, window->WindowPadding.x - spacing_x);
}